

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_LDLt(TPZMatrix<std::complex<long_double>_> *this)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar4;
  ulong uVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  complex<long_double> __r_1;
  complex<long_double> __r_3;
  complex<long_double> tmp;
  undefined4 uVar10;
  undefined2 uVar11;
  undefined4 uVar12;
  undefined2 uVar13;
  complex<long_double> local_158;
  longdouble local_138;
  longdouble local_12c;
  ulong local_120;
  complex<long_double> local_118;
  complex<long_double> local_f8;
  ulong local_d8;
  ulong local_d0;
  longdouble local_c4;
  undefined1 local_b8 [32];
  complex<long_double> local_98;
  undefined1 local_78 [32];
  complex<long_double> local_58;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
  }
  uVar2 = (uint)(this->super_TPZBaseMatrix).fRow;
  if (0 < (int)uVar2) {
    local_120 = (ulong)(uVar2 & 0x7fffffff);
    local_d8 = 1;
    local_c4 = (longdouble)1e-16;
    uVar4 = 0;
    do {
      local_138 = (longdouble)0;
      local_12c = local_138;
      lVar6 = in_ST0;
      lVar7 = in_ST1;
      lVar8 = in_ST2;
      lVar9 = in_ST3;
      if (uVar4 != 0) {
        uVar3 = 0;
        local_138 = (longdouble)0;
        local_12c = local_138;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_118,this,uVar3,uVar3);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_b8,this,uVar3,uVar4);
          local_98._M_value._0_8_ = SUB108(local_b8._0_10_,0);
          local_98._M_value._8_2_ = SUB102(local_b8._0_10_,8);
          local_98._M_value._16_8_ = SUB108(-(longdouble)local_b8._16_10_,0);
          local_98._M_value._24_2_ = SUB102((unkuint10)-(longdouble)local_b8._16_10_ >> 0x40,0);
          local_f8._M_value._0_4_ = local_118._M_value._0_4_;
          local_f8._M_value._4_4_ = local_118._M_value._4_4_;
          local_f8._M_value._8_2_ = local_118._M_value._8_2_;
          local_f8._M_value._10_2_ = local_118._M_value._10_2_;
          local_f8._M_value._12_4_ =
               SUB84(CONCAT26(local_118._M_value._14_2_,
                              CONCAT42(local_118._M_value._10_4_,local_118._M_value._8_2_)) >> 0x20,
                     0);
          local_f8._M_value._16_4_ = local_118._M_value._16_4_;
          local_f8._M_value._20_4_ = local_118._M_value._20_4_;
          local_f8._M_value._24_2_ = local_118._M_value._24_2_;
          local_f8._M_value._26_2_ = local_118._M_value._26_2_;
          local_f8._M_value._28_4_ =
               SUB84(CONCAT26(local_118._M_value._30_2_,
                              CONCAT42(local_118._M_value._26_4_,local_118._M_value._24_2_)) >> 0x20
                     ,0);
          std::complex<long_double>::operator*=(&local_f8,&local_98);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((complex<long_double> *)local_78,this,uVar3,uVar4);
          local_158._M_value._16_4_ = local_f8._M_value._16_4_;
          local_158._M_value._20_4_ = local_f8._M_value._20_4_;
          local_158._M_value._24_2_ = local_f8._M_value._24_2_;
          local_158._M_value._26_2_ = local_f8._M_value._26_2_;
          local_158._M_value._28_2_ = local_f8._M_value._28_2_;
          local_158._M_value._30_2_ = local_f8._M_value._30_2_;
          local_158._M_value._0_4_ = local_f8._M_value._0_4_;
          local_158._M_value._4_4_ = local_f8._M_value._4_4_;
          local_158._M_value._8_2_ = local_f8._M_value._8_2_;
          local_158._M_value._10_2_ = local_f8._M_value._10_2_;
          local_158._M_value._12_2_ = local_f8._M_value._12_2_;
          local_158._M_value._14_2_ = local_f8._M_value._14_2_;
          std::complex<long_double>::operator*=(&local_158,(complex<long_double> *)local_78);
          local_138 = (longdouble)
                      CONCAT28(local_158._M_value._8_2_,
                               CONCAT44(local_158._M_value._4_4_,local_158._M_value._0_4_)) +
                      local_138;
          local_12c = (longdouble)
                      CONCAT28(local_158._M_value._24_2_,
                               CONCAT44(local_158._M_value._20_4_,local_158._M_value._16_4_)) +
                      local_12c;
          uVar3 = uVar3 + 1;
          lVar7 = in_ST1;
          lVar8 = in_ST2;
          lVar9 = in_ST3;
        } while (uVar4 != uVar3);
      }
      in_ST3 = in_ST4;
      in_ST2 = lVar9;
      in_ST1 = lVar8;
      in_ST0 = lVar7;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_f8,this,uVar4,uVar4);
      local_158._M_value._10_2_ = local_f8._M_value._10_2_;
      local_158._M_value._12_2_ = local_f8._M_value._12_2_;
      local_158._M_value._14_2_ = local_f8._M_value._14_2_;
      local_158._M_value._26_2_ = local_f8._M_value._26_2_;
      local_158._M_value._28_2_ = local_f8._M_value._28_2_;
      local_158._M_value._30_2_ = local_f8._M_value._30_2_;
      lVar7 = (longdouble)
              CONCAT28(local_f8._M_value._8_2_,
                       CONCAT44(local_f8._M_value._4_4_,local_f8._M_value._0_4_)) - local_138;
      lVar8 = (longdouble)
              CONCAT28(local_f8._M_value._24_2_,
                       CONCAT44(local_f8._M_value._20_4_,local_f8._M_value._16_4_)) - local_12c;
      local_158._M_value._0_4_ = SUB104(lVar7,0);
      local_158._M_value._4_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
      local_158._M_value._8_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
      local_158._M_value._16_4_ = SUB104(lVar8,0);
      local_158._M_value._20_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
      local_158._M_value._24_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
      in_ST4 = in_ST3;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar4,uVar4,&local_158);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_f8,this,uVar4,uVar4);
      local_158._M_value._0_4_ = local_f8._M_value._0_4_;
      local_158._M_value._4_4_ = local_f8._M_value._4_4_;
      local_158._M_value._8_2_ = local_f8._M_value._8_2_;
      local_158._M_value._16_4_ = local_f8._M_value._16_4_;
      local_158._M_value._20_4_ = local_f8._M_value._20_4_;
      local_158._M_value._24_2_ = local_f8._M_value._24_2_;
      uVar10 = local_f8._M_value._0_4_;
      uVar11 = local_f8._M_value._8_2_;
      uVar12 = local_f8._M_value._16_4_;
      uVar13 = local_f8._M_value._24_2_;
      cabsl();
      if (ABS(lVar6) < local_c4) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_d0 = uVar4 + 1;
      uVar3 = local_d8;
      if (local_d0 < local_120) {
        do {
          local_138 = (longdouble)0;
          local_12c = local_138;
          lVar6 = in_ST0;
          lVar7 = in_ST1;
          if (uVar4 != 0) {
            uVar5 = 0;
            local_138 = (longdouble)0;
            local_12c = local_138;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_98,this,uVar5,uVar5,in_R8,in_R9,uVar10,uVar11,uVar12,uVar13);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (local_78,this,uVar4,uVar5);
              local_b8._16_10_ = -(longdouble)local_78._16_10_;
              local_b8._0_10_ = local_78._0_10_;
              local_118._M_value._0_8_ = local_98._M_value._0_8_;
              local_118._M_value._8_2_ = local_98._M_value._8_2_;
              local_118._M_value._10_4_ = local_98._M_value._10_4_;
              local_118._M_value._14_2_ = local_98._M_value._14_2_;
              local_118._M_value._16_8_ = local_98._M_value._16_8_;
              local_118._M_value._24_2_ = local_98._M_value._24_2_;
              local_118._M_value._26_4_ = local_98._M_value._26_4_;
              local_118._M_value._30_2_ = local_98._M_value._30_2_;
              std::complex<long_double>::operator*=(&local_118,(complex<long_double> *)local_b8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_58,this,uVar3,uVar5);
              local_158._M_value._16_4_ = local_118._M_value._16_4_;
              local_158._M_value._20_4_ = local_118._M_value._20_4_;
              local_158._M_value._24_2_ = local_118._M_value._24_2_;
              local_158._M_value._26_2_ = local_118._M_value._26_2_;
              local_158._M_value._28_2_ = local_118._M_value._28_2_;
              local_158._M_value._30_2_ = local_118._M_value._30_2_;
              local_158._M_value._0_4_ = local_118._M_value._0_4_;
              local_158._M_value._4_4_ = local_118._M_value._4_4_;
              local_158._M_value._8_2_ = local_118._M_value._8_2_;
              local_158._M_value._10_2_ = local_118._M_value._10_2_;
              local_158._M_value._12_2_ = local_118._M_value._12_2_;
              local_158._M_value._14_2_ = local_118._M_value._14_2_;
              std::complex<long_double>::operator*=(&local_158,&local_58);
              local_138 = (longdouble)
                          CONCAT28(local_158._M_value._8_2_,
                                   CONCAT44(local_158._M_value._4_4_,local_158._M_value._0_4_)) +
                          local_138;
              local_12c = (longdouble)
                          CONCAT28(local_158._M_value._24_2_,
                                   CONCAT44(local_158._M_value._20_4_,local_158._M_value._16_4_)) +
                          local_12c;
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          in_ST1 = in_ST3;
          in_ST0 = in_ST2;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_118,this,uVar3,uVar4);
          lVar8 = (longdouble)CONCAT28(local_118._M_value._8_2_,local_118._M_value._0_8_) -
                  local_138;
          local_158._M_value._14_2_ = local_118._M_value._14_2_;
          local_158._M_value._10_2_ = local_118._M_value._10_2_;
          local_158._M_value._12_2_ = local_118._M_value._12_2_;
          lVar9 = (longdouble)CONCAT28(local_118._M_value._24_2_,local_118._M_value._16_8_) -
                  local_12c;
          local_158._M_value._30_2_ = local_118._M_value._30_2_;
          local_158._M_value._26_2_ = local_118._M_value._26_2_;
          local_158._M_value._28_2_ = local_118._M_value._28_2_;
          local_158._M_value._0_4_ = SUB104(lVar8,0);
          local_158._M_value._4_4_ = SUB104((unkuint10)lVar8 >> 0x20,0);
          local_158._M_value._8_2_ = SUB102((unkuint10)lVar8 >> 0x40,0);
          local_158._M_value._16_4_ = SUB104(lVar9,0);
          local_158._M_value._20_4_ = SUB104((unkuint10)lVar9 >> 0x20,0);
          local_158._M_value._24_2_ = SUB102((unkuint10)lVar9 >> 0x40,0);
          in_ST2 = in_ST1;
          in_ST3 = in_ST1;
          in_ST4 = in_ST1;
          uVar10 = local_158._M_value._0_4_;
          uVar11 = local_158._M_value._8_2_;
          uVar12 = local_158._M_value._16_4_;
          uVar13 = local_158._M_value._24_2_;
          __divxc3();
          local_158._M_value._0_4_ = SUB104(lVar6,0);
          local_158._M_value._4_4_ = SUB104((unkuint10)lVar6 >> 0x20,0);
          local_158._M_value._8_2_ = SUB102((unkuint10)lVar6 >> 0x40,0);
          local_158._M_value._16_4_ = SUB104(lVar7,0);
          local_158._M_value._20_4_ = SUB104((unkuint10)lVar7 >> 0x20,0);
          local_158._M_value._24_2_ = SUB102((unkuint10)lVar7 >> 0x40,0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar3,uVar4,&local_158);
          lVar6 = -(longdouble)
                   CONCAT28(local_158._M_value._24_2_,
                            CONCAT44(local_158._M_value._20_4_,local_158._M_value._16_4_));
          local_158._M_value._16_4_ = SUB104(lVar6,0);
          local_158._M_value._20_4_ = SUB104((unkuint10)lVar6 >> 0x20,0);
          local_158._M_value._24_2_ = SUB102((unkuint10)lVar6 >> 0x40,0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar4,uVar3,&local_158);
          uVar3 = uVar3 + 1;
        } while (uVar3 != local_120);
      }
      local_d8 = local_d8 + 1;
      uVar4 = local_d0;
    } while (local_d0 != local_120);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}